

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

bool __thiscall ON_Font::Write(ON_Font *this,ON_BinaryArchive *file)

{
  ON_wString *this_00;
  ON_wString *s;
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ON_wString *pOVar5;
  ON_wString *pOVar6;
  ON_wString *src;
  uchar quartet_member_as_unsigned;
  ON_wString obsolete_font_description;
  ON_wString local_58;
  ON_wString local_50;
  ON_wString *local_48;
  ON_wString *local_40;
  ON_wString *local_38;
  
  iVar3 = ON_BinaryArchive::Archive3dmVersion(file);
  if ((iVar3 < 0x3c) ||
     (uVar4 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file),
     uVar4 < ON_TextStyle::binary_archive_opennurbs_version)) {
    ON_WarningEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                 ,0x2906,"","This font should probably be an ON_TextStyle.");
    bVar1 = WriteV5(this,this->m_runtime_serial_number,(ON_UUID)ZEXT816((ulong)0),file);
    return bVar1;
  }
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,6);
  if (!bVar1) {
    return false;
  }
  uVar4 = Internal_FontCharacteristicsAsUnsigned
                    (this->m_font_weight,this->m_font_style,this->m_font_stretch,
                     this->m_font_bUnderlined,this->m_font_bStrikethrough);
  bVar1 = ON_BinaryArchive::WriteInt(file,uVar4);
  if (bVar1) {
    this_00 = &this->m_loc_windows_logfont_name;
    s = &this->m_en_windows_logfont_name;
    bVar1 = ON_wString::IsNotEmpty(this_00);
    pOVar5 = s;
    if (bVar1) {
      pOVar5 = this_00;
    }
    ON_wString::ON_wString(&local_50,pOVar5);
    bVar1 = ON_BinaryArchive::WriteWideString(file,&local_50);
    ON_wString::~ON_wString(&local_50);
    if (bVar1) {
      pOVar5 = &this->m_loc_postscript_name;
      bVar1 = ON_wString::IsNotEmpty(pOVar5);
      pOVar6 = &this->m_en_postscript_name;
      if (bVar1) {
        pOVar6 = pOVar5;
      }
      local_48 = &this->m_en_postscript_name;
      ON_wString::ON_wString(&local_50,pOVar6);
      bVar1 = ON_BinaryArchive::WriteString(file,&local_50);
      ON_wString::~ON_wString(&local_50);
      if (bVar1) {
        bVar1 = ON_wString::IsNotEmpty(pOVar5);
        pOVar6 = local_48;
        if (bVar1) {
          pOVar6 = pOVar5;
        }
        ON_wString::ON_wString(&local_50,pOVar6);
        bVar1 = ON_wString::IsEmpty(&local_50);
        if (bVar1) {
          bVar1 = ON_wString::IsNotEmpty(&this->m_loc_family_name);
          pOVar6 = &this->m_en_family_name;
          if (bVar1) {
            pOVar6 = &this->m_loc_family_name;
          }
          ON_wString::ON_wString(&local_58,pOVar6);
          ON_wString::operator=(&local_50,&local_58);
          ON_wString::~ON_wString(&local_58);
        }
        bVar1 = ON_wString::IsEmpty(&local_50);
        if (bVar1) {
          bVar1 = ON_wString::IsNotEmpty(this_00);
          pOVar6 = s;
          if (bVar1) {
            pOVar6 = this_00;
          }
          ON_wString::ON_wString(&local_58,pOVar6);
          ON_wString::operator=(&local_50,&local_58);
          ON_wString::~ON_wString(&local_58);
        }
        bVar1 = ON_BinaryArchive::WriteString(file,&local_50);
        if ((((bVar1) &&
             (bVar1 = ON_BinaryArchive::WriteInt(file,this->m_windows_logfont_weight), bVar1)) &&
            (bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_apple_font_weight_trait), bVar1)) &&
           ((bVar1 = ON_BinaryArchive::WriteDouble(file,this->m_point_size), bVar1 &&
            (bVar1 = ON_BinaryArchive::WriteBool(file,false), bVar1)))) {
          pOVar6 = &this->m_loc_family_name;
          bVar1 = ON_wString::IsNotEmpty(pOVar6);
          local_40 = &this->m_en_family_name;
          src = local_40;
          if (bVar1) {
            src = pOVar6;
          }
          ON_wString::ON_wString(&local_58,src);
          local_38 = pOVar6;
          bVar1 = ON_BinaryArchive::WriteString(file,&local_58);
          ON_wString::~ON_wString(&local_58);
          if (((((!bVar1) ||
                (bVar1 = ON_BinaryArchive::WriteString(file,&this->m_locale_name), !bVar1)) ||
               ((bVar1 = ON_BinaryArchive::WriteString(file,pOVar5), !bVar1 ||
                (((bVar1 = ON_BinaryArchive::WriteString(file,local_48), !bVar1 ||
                  (bVar1 = ON_BinaryArchive::WriteString(file,this_00), !bVar1)) ||
                 (bVar1 = ON_BinaryArchive::WriteString(file,s), !bVar1)))))) ||
              ((bVar1 = ON_BinaryArchive::WriteString(file,local_38), !bVar1 ||
               (bVar1 = ON_BinaryArchive::WriteString(file,local_40), !bVar1)))) ||
             ((bVar1 = ON_BinaryArchive::WriteString(file,&this->m_loc_face_name), !bVar1 ||
              ((bVar1 = ON_BinaryArchive::WriteString(file,&this->m_en_face_name), !bVar1 ||
               (bVar1 = ON_PANOSE1::Write(&this->m_panose1,file), !bVar1)))))) goto LAB_00487072;
          local_58.m_s._0_1_ = this->m_quartet_member;
          bVar1 = ON_BinaryArchive::WriteByte(file,1,&local_58);
        }
        else {
LAB_00487072:
          bVar1 = false;
        }
        ON_wString::~ON_wString(&local_50);
        goto LAB_00487058;
      }
    }
  }
  bVar1 = false;
LAB_00487058:
  bVar2 = ON_BinaryArchive::EndWrite3dmChunk(file);
  return (bool)(bVar2 & bVar1);
}

Assistant:

bool ON_Font::Write(
  ON_BinaryArchive& file // serialize definition to binary archive
  ) const
{

  if (file.Archive3dmVersion() < 60 
    || file.ArchiveOpenNURBSVersion() < ON_TextStyle::binary_archive_opennurbs_version
    )
  {
    ON_WARNING("This font should probably be an ON_TextStyle.");
    return WriteV5(
      RuntimeSerialNumber(),
      ON_nil_uuid,
      file
      );
  }


  if (!file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,6))
    return false;

  bool rc = false;
  for (;;)
  {
    // version 1.0
    unsigned int fc = FontCharacteristicsAsUnsigned();
    if (!file.WriteInt(fc))
      break;

    // Windows LOGFONT.lfFaceName
    if ( !file.WriteWideString(WindowsLogfontName()) )
      break;

    // PostScript name
    if (!file.WriteString(PostScriptName()))
      break;

    // version 1.1 added font_description August 2016
    ON_wString obsolete_font_description = PostScriptName();
    if (obsolete_font_description.IsEmpty())
      obsolete_font_description = FamilyName();
    if (obsolete_font_description.IsEmpty())
      obsolete_font_description = WindowsLogfontName();
    if (!file.WriteString(obsolete_font_description))
      break;

    // version 1.2 added m_windows_logfont_weight and m_apple_font_weight_trait
    if (!file.WriteInt(m_windows_logfont_weight))
      break;

    if (!file.WriteDouble(m_apple_font_weight_trait))
      break;

    // version 1.3 added additional m_point_size and m_LOGFONT_* values.
    if (!file.WriteDouble(m_point_size))
      break;

    const bool bOBSOLETEBool = false;
    if (!file.WriteBool(bOBSOLETEBool))
      break;
    
    // version 1.4 explicit Family name
    if (!file.WriteString(FamilyName()))
      break;

    // version 1.5 explicit names in loc and en and PANOSE1 settings
    if (!file.WriteString(m_locale_name))
      break;

    bool bFontNamesSaved = false;
    for(;;)
    {
      // NEVER commit code with this define set.
      //
      // This code is used by developers to create files used to test
      // code and UI for handing situations when a font is not installed
      // on a device.
      //
      // To create a missing font test .3dm file, you must modify code 
      // int opennurbs_font.cpp and in opennurbs_text.cpp. 
      // Search for CREATE_MISSING_FONT_TEST_3DM_FILE to find the locations.
//#define CREATE_MISSING_FONT_TEST_3DM_FILE
#if defined(CREATE_MISSING_FONT_TEST_3DM_FILE)
      // All fonts in the Family with MISSING_FONT_TEST_valid_family_name 
      // will be saved as a family named missing_family_name.
      const ON_wString MISSING_FONT_TEST_valid_font_family_name(L"Courier New");
      if (MISSING_FONT_TEST_valid_font_family_name == FamilyName() && FaceName().IsNotEmpty())
      {
        // Write Missing Font names
        const ON_wString missing_font_family_name(L"Missing Font Test");
        const ON_wString missing_font_face_name(FaceName());
        const ON_wString missing_font_logfont_name(missing_font_family_name);
        ON_wString missing_font_postscript_name = missing_font_family_name + L"-" + missing_font_face_name;
        missing_font_postscript_name.Remove(ON_wString::Space);
        // local and english postscript name
        if (!file.WriteString(missing_font_postscript_name))
          break;
        if (!file.WriteString(missing_font_postscript_name))
          break;
        // local and english logfont name
        if (!file.WriteString(missing_font_logfont_name))
          break;
        if (!file.WriteString(missing_font_logfont_name))
          break;
        // local and english family name
        if (!file.WriteString(missing_font_family_name))
          break;
        if (!file.WriteString(missing_font_family_name))
          break;
        // local and english face name
        if (!file.WriteString(missing_font_face_name))
          break;
        if (!file.WriteString(missing_font_face_name))
          break;

        bFontNamesSaved = true;
        break;
      }
#endif

      // write correct names
      if (!file.WriteString(m_loc_postscript_name))
        break;
      if (!file.WriteString(m_en_postscript_name))
        break;
      if (!file.WriteString(m_loc_windows_logfont_name))
        break;
      if (!file.WriteString(m_en_windows_logfont_name))
        break;
      if (!file.WriteString(m_loc_family_name))
        break;
      if (!file.WriteString(m_en_family_name))
        break;
      if (!file.WriteString(m_loc_face_name))
        break;
      if (!file.WriteString(m_en_face_name))
        break;

      bFontNamesSaved = true;
      break;
    }

    if (false == bFontNamesSaved)
      break; // errors writing font names


    if (!m_panose1.Write(file))
      break;

    // version 1.6 rich text quartet member (regular/bold/italic/bold-italic)
    const unsigned char quartet_member_as_unsigned = static_cast<unsigned char>(this->m_quartet_member);
    if (!file.WriteByte(1,&quartet_member_as_unsigned))
      break;

    rc = true;
    break;
  }

  if (!file.EndWrite3dmChunk())
    rc = false;

  return rc;
}